

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O3

pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
cmUVProcessChain::Status::GetException_abi_cxx11_
          (pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Status *this)

{
  char *__s;
  allocator<char> *__a;
  char buf [256];
  allocator<char> local_119;
  allocator<char> local_118 [264];
  
  if (this->SpawnResult != 0) {
    __s = uv_strerror(this->SpawnResult);
    __return_storage_ptr__->first = Spawn;
    __a = local_118;
    goto LAB_003e0a17;
  }
  if (this->Finished == true) {
    switch(this->TermSignal) {
    case 0:
      goto switchD_003e09fc_caseD_0;
    case 1:
      __return_storage_ptr__->first = Other;
      __s = "SIGHUP";
      break;
    case 2:
      __return_storage_ptr__->first = Interrupt;
      __s = "User interrupt";
      break;
    case 3:
      __return_storage_ptr__->first = Other;
      __s = "SIGQUIT";
      break;
    case 4:
      __return_storage_ptr__->first = Illegal;
      __s = "Illegal instruction";
      break;
    case 5:
      __return_storage_ptr__->first = Other;
      __s = "SIGTRAP";
      break;
    case 6:
      __return_storage_ptr__->first = Other;
      __s = "Subprocess aborted";
      break;
    case 7:
      __return_storage_ptr__->first = Fault;
      __s = "Bus error";
      break;
    case 8:
      __return_storage_ptr__->first = Numerical;
      __s = "Floating-point exception";
      break;
    case 9:
      __return_storage_ptr__->first = Other;
      __s = "Subprocess killed";
      break;
    case 10:
      __return_storage_ptr__->first = Other;
      __s = "SIGUSR1";
      break;
    case 0xb:
      __return_storage_ptr__->first = Fault;
      __s = "Segmentation fault";
      break;
    case 0xc:
      __return_storage_ptr__->first = Other;
      __s = "SIGUSR2";
      break;
    case 0xd:
      __return_storage_ptr__->first = Other;
      __s = "SIGPIPE";
      break;
    case 0xe:
      __return_storage_ptr__->first = Other;
      __s = "SIGALRM";
      break;
    case 0xf:
      __return_storage_ptr__->first = Other;
      __s = "Subprocess terminated";
      break;
    case 0x10:
      __return_storage_ptr__->first = Other;
      __s = "SIGSTKFLT";
      break;
    case 0x11:
      __return_storage_ptr__->first = Other;
      __s = "SIGCHLD";
      break;
    case 0x12:
      __return_storage_ptr__->first = Other;
      __s = "SIGCONT";
      break;
    case 0x13:
      __return_storage_ptr__->first = Other;
      __s = "SIGSTOP";
      break;
    case 0x14:
      __return_storage_ptr__->first = Other;
      __s = "SIGTSTP";
      break;
    case 0x15:
      __return_storage_ptr__->first = Other;
      __s = "SIGTTIN";
      break;
    case 0x16:
      __return_storage_ptr__->first = Other;
      __s = "SIGTTOU";
      break;
    case 0x17:
      __return_storage_ptr__->first = Other;
      __s = "SIGURG";
      break;
    case 0x18:
      __return_storage_ptr__->first = Other;
      __s = "SIGXCPU";
      break;
    case 0x19:
      __return_storage_ptr__->first = Other;
      __s = "SIGXFSZ";
      break;
    case 0x1a:
      __return_storage_ptr__->first = Other;
      __s = "SIGVTALRM";
      break;
    case 0x1b:
      __return_storage_ptr__->first = Other;
      __s = "SIGPROF";
      break;
    case 0x1c:
      __return_storage_ptr__->first = Other;
      __s = "SIGWINCH";
      break;
    case 0x1d:
      __return_storage_ptr__->first = Other;
      __s = "SIGPOLL";
      break;
    case 0x1e:
      __return_storage_ptr__->first = Other;
      __s = "SIGPWR";
      break;
    case 0x1f:
      __return_storage_ptr__->first = Other;
      __s = "SIGSYS";
      break;
    default:
      __s = (char *)local_118;
      snprintf(__s,0x100,"Signal %d");
      __return_storage_ptr__->first = Other;
      __a = &local_119;
      goto LAB_003e0a17;
    }
  }
  else {
switchD_003e09fc_caseD_0:
    __return_storage_ptr__->first = None;
    __s = "";
  }
  __a = local_118;
LAB_003e0a17:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__return_storage_ptr__->second,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::pair<cmUVProcessChain::ExceptionCode, std::string>
cmUVProcessChain::Status::GetException() const
{
  if (this->SpawnResult) {
    return std::make_pair(ExceptionCode::Spawn,
                          uv_strerror(this->SpawnResult));
  }
#ifdef _WIN32
  if (this->Finished && (this->ExitStatus & 0xF0000000) == 0xC0000000) {
    // Child terminated due to exceptional behavior.
    switch (this->ExitStatus) {
      case STATUS_CONTROL_C_EXIT:
        return std::make_pair(ExceptionCode::Interrupt, "User interrupt");

      case STATUS_FLOAT_DENORMAL_OPERAND:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point exception (denormal operand)");
      case STATUS_FLOAT_DIVIDE_BY_ZERO:
        return std::make_pair(ExceptionCode::Numerical, "Divide-by-zero");
      case STATUS_FLOAT_INEXACT_RESULT:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point exception (inexact result)");
      case STATUS_FLOAT_INVALID_OPERATION:
        return std::make_pair(ExceptionCode::Numerical,
                              "Invalid floating-point operation");
      case STATUS_FLOAT_OVERFLOW:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point overflow");
      case STATUS_FLOAT_STACK_CHECK:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point stack check failed");
      case STATUS_FLOAT_UNDERFLOW:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point underflow");
#  ifdef STATUS_FLOAT_MULTIPLE_FAULTS
      case STATUS_FLOAT_MULTIPLE_FAULTS:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point exception (multiple faults)");
#  endif
#  ifdef STATUS_FLOAT_MULTIPLE_TRAPS
      case STATUS_FLOAT_MULTIPLE_TRAPS:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point exception (multiple traps)");
#  endif
      case STATUS_INTEGER_DIVIDE_BY_ZERO:
        return std::make_pair(ExceptionCode::Numerical,
                              "Integer divide-by-zero");
      case STATUS_INTEGER_OVERFLOW:
        return std::make_pair(ExceptionCode::Numerical, "Integer overflow");

      case STATUS_DATATYPE_MISALIGNMENT:
        return std::make_pair(ExceptionCode::Fault, "Datatype misalignment");
      case STATUS_ACCESS_VIOLATION:
        return std::make_pair(ExceptionCode::Fault, "Access violation");
      case STATUS_IN_PAGE_ERROR:
        return std::make_pair(ExceptionCode::Fault, "In-page error");
      case STATUS_INVALID_HANDLE:
        return std::make_pair(ExceptionCode::Fault, "Invalid handle");
      case STATUS_NONCONTINUABLE_EXCEPTION:
        return std::make_pair(ExceptionCode::Fault,
                              "Noncontinuable exception");
      case STATUS_INVALID_DISPOSITION:
        return std::make_pair(ExceptionCode::Fault, "Invalid disposition");
      case STATUS_ARRAY_BOUNDS_EXCEEDED:
        return std::make_pair(ExceptionCode::Fault, "Array bounds exceeded");
      case STATUS_STACK_OVERFLOW:
        return std::make_pair(ExceptionCode::Fault, "Stack overflow");

      case STATUS_ILLEGAL_INSTRUCTION:
        return std::make_pair(ExceptionCode::Illegal, "Illegal instruction");
      case STATUS_PRIVILEGED_INSTRUCTION:
        return std::make_pair(ExceptionCode::Illegal,
                              "Privileged instruction");

      case STATUS_NO_MEMORY:
      default: {
        char buf[256];
        snprintf(buf, sizeof(buf), "Exit code 0x%x\n",
                 static_cast<unsigned int>(this->ExitStatus));
        return std::make_pair(ExceptionCode::Other, buf);
      }
    }
  }
#else
  if (this->Finished && this->TermSignal) {
    switch (this->TermSignal) {
#  ifdef SIGSEGV
      case SIGSEGV:
        return std::make_pair(ExceptionCode::Fault, "Segmentation fault");
#  endif
#  ifdef SIGBUS
#    if !defined(SIGSEGV) || SIGBUS != SIGSEGV
      case SIGBUS:
        return std::make_pair(ExceptionCode::Fault, "Bus error");
#    endif
#  endif
#  ifdef SIGFPE
      case SIGFPE:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point exception");
#  endif
#  ifdef SIGILL
      case SIGILL:
        return std::make_pair(ExceptionCode::Illegal, "Illegal instruction");
#  endif
#  ifdef SIGINT
      case SIGINT:
        return std::make_pair(ExceptionCode::Interrupt, "User interrupt");
#  endif
#  ifdef SIGABRT
      case SIGABRT:
        return std::make_pair(ExceptionCode::Other, "Subprocess aborted");
#  endif
#  ifdef SIGKILL
      case SIGKILL:
        return std::make_pair(ExceptionCode::Other, "Subprocess killed");
#  endif
#  ifdef SIGTERM
      case SIGTERM:
        return std::make_pair(ExceptionCode::Other, "Subprocess terminated");
#  endif
#  ifdef SIGHUP
      case SIGHUP:
        return std::make_pair(ExceptionCode::Other, "SIGHUP");
#  endif
#  ifdef SIGQUIT
      case SIGQUIT:
        return std::make_pair(ExceptionCode::Other, "SIGQUIT");
#  endif
#  ifdef SIGTRAP
      case SIGTRAP:
        return std::make_pair(ExceptionCode::Other, "SIGTRAP");
#  endif
#  ifdef SIGIOT
#    if !defined(SIGABRT) || SIGIOT != SIGABRT
      case SIGIOT:
        return std::make_pair(ExceptionCode::Other, "SIGIOT");
#    endif
#  endif
#  ifdef SIGUSR1
      case SIGUSR1:
        return std::make_pair(ExceptionCode::Other, "SIGUSR1");
#  endif
#  ifdef SIGUSR2
      case SIGUSR2:
        return std::make_pair(ExceptionCode::Other, "SIGUSR2");
#  endif
#  ifdef SIGPIPE
      case SIGPIPE:
        return std::make_pair(ExceptionCode::Other, "SIGPIPE");
#  endif
#  ifdef SIGALRM
      case SIGALRM:
        return std::make_pair(ExceptionCode::Other, "SIGALRM");
#  endif
#  ifdef SIGSTKFLT
      case SIGSTKFLT:
        return std::make_pair(ExceptionCode::Other, "SIGSTKFLT");
#  endif
#  ifdef SIGCHLD
      case SIGCHLD:
        return std::make_pair(ExceptionCode::Other, "SIGCHLD");
#  elif defined(SIGCLD)
      case SIGCLD:
        return std::make_pair(ExceptionCode::Other, "SIGCLD");
#  endif
#  ifdef SIGCONT
      case SIGCONT:
        return std::make_pair(ExceptionCode::Other, "SIGCONT");
#  endif
#  ifdef SIGSTOP
      case SIGSTOP:
        return std::make_pair(ExceptionCode::Other, "SIGSTOP");
#  endif
#  ifdef SIGTSTP
      case SIGTSTP:
        return std::make_pair(ExceptionCode::Other, "SIGTSTP");
#  endif
#  ifdef SIGTTIN
      case SIGTTIN:
        return std::make_pair(ExceptionCode::Other, "SIGTTIN");
#  endif
#  ifdef SIGTTOU
      case SIGTTOU:
        return std::make_pair(ExceptionCode::Other, "SIGTTOU");
#  endif
#  ifdef SIGURG
      case SIGURG:
        return std::make_pair(ExceptionCode::Other, "SIGURG");
#  endif
#  ifdef SIGXCPU
      case SIGXCPU:
        return std::make_pair(ExceptionCode::Other, "SIGXCPU");
#  endif
#  ifdef SIGXFSZ
      case SIGXFSZ:
        return std::make_pair(ExceptionCode::Other, "SIGXFSZ");
#  endif
#  ifdef SIGVTALRM
      case SIGVTALRM:
        return std::make_pair(ExceptionCode::Other, "SIGVTALRM");
#  endif
#  ifdef SIGPROF
      case SIGPROF:
        return std::make_pair(ExceptionCode::Other, "SIGPROF");
#  endif
#  ifdef SIGWINCH
      case SIGWINCH:
        return std::make_pair(ExceptionCode::Other, "SIGWINCH");
#  endif
#  ifdef SIGPOLL
      case SIGPOLL:
        return std::make_pair(ExceptionCode::Other, "SIGPOLL");
#  endif
#  ifdef SIGIO
#    if !defined(SIGPOLL) || SIGIO != SIGPOLL
      case SIGIO:
        return std::make_pair(ExceptionCode::Other, "SIGIO");
#    endif
#  endif
#  ifdef SIGPWR
      case SIGPWR:
        return std::make_pair(ExceptionCode::Other, "SIGPWR");
#  endif
#  ifdef SIGSYS
      case SIGSYS:
        return std::make_pair(ExceptionCode::Other, "SIGSYS");
#  endif
#  ifdef SIGUNUSED
#    if !defined(SIGSYS) || SIGUNUSED != SIGSYS
      case SIGUNUSED:
        return std::make_pair(ExceptionCode::Other, "SIGUNUSED");
#    endif
#  endif
      default: {
        char buf[256];
        snprintf(buf, sizeof(buf), "Signal %d", this->TermSignal);
        return std::make_pair(ExceptionCode::Other, buf);
      }
    }
  }
#endif
  return std::make_pair(ExceptionCode::None, "");
}